

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O2

void __thiscall
qclab::qgates::SWAP<float>::apply
          (SWAP<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  int iVar1;
  int iVar2;
  anon_class_8_1_703dd281 f;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_8_1_703dd281 local_40;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[5])(&local_38,this);
  iVar1 = *local_38._M_impl.super__Vector_impl_data._M_start;
  *local_38._M_impl.super__Vector_impl_data._M_start = iVar1 + offset;
  iVar2 = local_38._M_impl.super__Vector_impl_data._M_start[1];
  local_38._M_impl.super__Vector_impl_data._M_start[1] = offset + iVar2;
  local_40.vector = *(float **)vector;
  apply4bc<qclab::qgates::lambda_SWAP<float>(qclab::Op,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar1 + offset,offset + iVar2,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void SWAP< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                         const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_SWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }